

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O3

int logger_timed_log_test(bool is_global)

{
  long *plVar1;
  SimpleLogger *pSVar2;
  size_type *psVar3;
  int __how;
  anon_class_16_2_486d2e63_for__M_head_impl *__f;
  thread t2;
  thread t1;
  SimpleLogger *ll;
  string filename;
  anon_class_16_2_486d2e63_for__M_head_impl worker_func;
  string prefix;
  thread local_98;
  thread local_90;
  SimpleLogger *local_88;
  string local_80;
  undefined1 local_60 [16];
  char local_50 [16];
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"logger_timed_log_test","");
  TestSuite::clearTestFile(&local_40,MIDDLE_OF_TEST);
  TestSuite::getTestFileName((string *)local_60,&local_40);
  plVar1 = (long *)std::__cxx11::string::append(local_60);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_80.field_2._M_allocated_capacity = *psVar3;
    local_80.field_2._8_8_ = plVar1[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar3;
    local_80._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_80._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((char *)local_60._0_8_ != local_50) {
    operator_delete((void *)local_60._0_8_);
  }
  local_88 = (SimpleLogger *)0x0;
  std::chrono::_V2::system_clock::now();
  pSVar2 = (SimpleLogger *)operator_new(0x2c8);
  SimpleLogger::SimpleLogger(pSVar2,&local_80,0x80,0x100000,0);
  local_88 = pSVar2;
  SimpleLogger::start(pSVar2);
  SimpleLogger::setLogLevel(local_88,6);
  local_60._0_8_ = &local_88;
  local_60[8] = is_global;
  std::thread::thread<logger_timed_log_test(bool)::__0&,int,void>
            (&local_90,(anon_class_16_2_486d2e63_for__M_head_impl *)local_60,(int *)0x1);
  __f = (anon_class_16_2_486d2e63_for__M_head_impl *)local_60;
  std::thread::thread<logger_timed_log_test(bool)::__0&,int,void>(&local_98,__f,(int *)0x2);
  __how = (int)__f;
  if (local_90._M_id._M_thread != 0) {
    std::thread::join();
  }
  if (local_98._M_id._M_thread != 0) {
    std::thread::join();
  }
  pSVar2 = local_88;
  if (local_88 != (SimpleLogger *)0x0) {
    SimpleLogger::~SimpleLogger(local_88);
  }
  operator_delete(pSVar2);
  SimpleLogger::shutdown((int)pSVar2,__how);
  TestSuite::clearTestFile(&local_40,END_OF_TEST);
  if ((local_98._M_id._M_thread == 0) && (local_90._M_id._M_thread == 0)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return 0;
  }
  std::terminate();
}

Assistant:

int logger_timed_log_test(bool is_global) {
    const std::string prefix = TEST_SUITE_AUTO_PREFIX;
    TestSuite::clearTestFile(prefix);
    std::string filename = TestSuite::getTestFileName(prefix) + ".log";

    SimpleLogger* ll = nullptr;
    TestSuite::Timer tt;

    ll = new SimpleLogger(filename, 128, 1024*1024, 0);
    ll->start();
    ll->setLogLevel(6);

    auto worker_func = [&ll, is_global](int tid) -> void {
        for (size_t ii=0; ii<100; ++ii) {
            SimpleLogger::Levels lv = (ii < 50)
                                      ? SimpleLogger::TRACE
                                      : SimpleLogger::UNKNOWN;
            if (is_global) {
                _timed_log_g(ll, 100, lv, SimpleLogger::INFO,
                             "thread %d, %zu", tid, ii);
            } else {
                _timed_log_t(ll, 100, lv, SimpleLogger::INFO,
                             "thread %d %zu", tid, ii);
            }
            TestSuite::sleep_ms(10);
        }
    };

    std::thread t1(worker_func, 1);
    std::thread t2(worker_func, 2);
    if (t1.joinable()) t1.join();
    if (t2.joinable()) t2.join();

    delete ll;

    SimpleLogger::shutdown();
    TestSuite::clearTestFile(prefix, TestSuite::END_OF_TEST);
    return 0;
}